

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O0

FT_Error cff_ps_get_font_extra(CFF_Face face,PS_FontExtraRec *afont_extra)

{
  CFF_Font_conflict pCVar1;
  PS_FontExtraRec *pPVar2;
  FT_String *__haystack;
  char *pcVar3;
  char *local_60;
  FT_String *s;
  FT_String *start_def;
  FT_String *start_fstype;
  FT_String *embedded_postscript;
  FT_Memory memory;
  PS_FontExtraRec *font_extra;
  CFF_FontRecDict dict;
  CFF_Font_conflict pCStack_20;
  FT_Error error;
  CFF_Font_conflict cff;
  PS_FontExtraRec *afont_extra_local;
  CFF_Face face_local;
  
  pCVar1 = (CFF_Font_conflict)(face->extra).data;
  dict._4_4_ = 0;
  pCStack_20 = pCVar1;
  cff = (CFF_Font_conflict)afont_extra;
  if ((pCVar1 != (CFF_Font_conflict)0x0) && (pCVar1->font_extra == (PS_FontExtraRec *)0x0)) {
    afont_extra_local = (PS_FontExtraRec *)face;
    pPVar2 = (PS_FontExtraRec *)ft_mem_alloc((face->root).memory,2,(FT_Error *)((long)&dict + 4));
    if (dict._4_4_ != 0) {
      return dict._4_4_;
    }
    pPVar2->fs_type = 0;
    __haystack = cff_index_get_sid_string
                           (pCStack_20,(pCVar1->top_font).font_dict.embedded_postscript);
    if (((__haystack != (FT_String *)0x0) &&
        (local_60 = strstr(__haystack,"/FSType"), local_60 != (char *)0x0)) &&
       (pcVar3 = strstr(local_60 + 7,"def"), pcVar3 != (char *)0x0)) {
      for (local_60 = local_60 + 7; local_60 != pcVar3; local_60 = local_60 + 1) {
        if ((*local_60 < '0') || ('9' < *local_60)) {
          if ((*local_60 != ' ') && ((*local_60 != '\n' && (*local_60 != '\r')))) {
            pPVar2->fs_type = 0;
            break;
          }
        }
        else {
          if (0x1997 < pPVar2->fs_type) {
            pPVar2->fs_type = 0;
            break;
          }
          pPVar2->fs_type = pPVar2->fs_type * 10;
          pPVar2->fs_type = pPVar2->fs_type + *local_60 + -0x30;
        }
      }
    }
    pCStack_20->font_extra = pPVar2;
  }
  if (pCStack_20 != (CFF_Font_conflict)0x0) {
    *(FT_UShort *)&cff->library = pCStack_20->font_extra->fs_type;
  }
  return dict._4_4_;
}

Assistant:

static FT_Error
  cff_ps_get_font_extra( CFF_Face          face,
                         PS_FontExtraRec*  afont_extra )
  {
    CFF_Font  cff   = (CFF_Font)face->extra.data;
    FT_Error  error = FT_Err_Ok;


    if ( cff && cff->font_extra == NULL )
    {
      CFF_FontRecDict   dict       = &cff->top_font.font_dict;
      PS_FontExtraRec*  font_extra = NULL;
      FT_Memory         memory     = face->root.memory;
      FT_String*        embedded_postscript;


      if ( FT_ALLOC( font_extra, sizeof ( *font_extra ) ) )
        goto Fail;

      font_extra->fs_type = 0U;

      embedded_postscript = cff_index_get_sid_string(
                              cff,
                              dict->embedded_postscript );
      if ( embedded_postscript )
      {
        FT_String*  start_fstype;
        FT_String*  start_def;


        /* Identify the XYZ integer in `/FSType XYZ def' substring. */
        if ( ( start_fstype = ft_strstr( embedded_postscript,
                                         "/FSType" ) ) != NULL    &&
             ( start_def = ft_strstr( start_fstype +
                                        sizeof ( "/FSType" ) - 1,
                                      "def" ) ) != NULL           )
        {
          FT_String*  s;


          for ( s = start_fstype + sizeof ( "/FSType" ) - 1;
                s != start_def;
                s++ )
          {
            if ( *s >= '0' && *s <= '9' )
            {
              if ( font_extra->fs_type >= ( FT_USHORT_MAX - 9 ) / 10 )
              {
                /* Overflow - ignore the FSType value.  */
                font_extra->fs_type = 0U;
                break;
              }

              font_extra->fs_type *= 10;
              font_extra->fs_type += (FT_UShort)( *s - '0' );
            }
            else if ( *s != ' ' && *s != '\n' && *s != '\r' )
            {
              /* Non-whitespace character between `/FSType' and next `def' */
              /* - ignore the FSType value.                                */
              font_extra->fs_type = 0U;
              break;
            }
          }
        }
      }

      cff->font_extra = font_extra;
    }

    if ( cff )
      *afont_extra = *cff->font_extra;

  Fail:
    return error;
  }